

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef
          (EliminateDeadOutputStoresPass *this,Instruction *ref,Instruction *var)

{
  LivenessManager *this_00;
  DefUseManager *pDVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  Op OVar5;
  IRContext *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  anon_class_16_2_7034404e local_e8;
  function<bool_(const_spvtools::opt::Instruction_&)> local_d8;
  uint32_t local_b4;
  Instruction *pIStack_b0;
  uint32_t ac_idx;
  Instruction *member_idx_inst;
  uint32_t member_idx_id;
  uint32_t str_type_id;
  Struct *str_type;
  Array *arr_type;
  Type *curr_type;
  Pointer *ptr_type;
  Type *var_type;
  uint32_t in_idx;
  Op ref_op;
  function<bool_(const_spvtools::opt::Instruction_&)> local_68;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t var_id;
  uint32_t builtin;
  LivenessManager *live_mgr;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  DecorationManager *deco_mgr;
  Instruction *var_local;
  Instruction *ref_local;
  EliminateDeadOutputStoresPass *this_local;
  
  deco_mgr = (DecorationManager *)var;
  var_local = ref;
  ref_local = (Instruction *)this;
  pIVar6 = Pass::context(&this->super_Pass);
  def_use_mgr = (DefUseManager *)IRContext::get_decoration_mgr(pIVar6);
  pIVar6 = Pass::context(&this->super_Pass);
  type_mgr = (TypeManager *)IRContext::get_def_use_mgr(pIVar6);
  pIVar6 = Pass::context(&this->super_Pass);
  live_mgr = (LivenessManager *)IRContext::get_type_mgr(pIVar6);
  pIVar6 = Pass::context(&this->super_Pass);
  _var_id = IRContext::get_liveness_mgr(pIVar6);
  local_44 = 0x7fffffff;
  uVar3 = opt::Instruction::result_id((Instruction *)deco_mgr);
  pDVar1 = def_use_mgr;
  _in_idx = &local_44;
  local_48 = uVar3;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(spvtools::opt::Instruction*,spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_68,
             (anon_class_8_1_911e5f03 *)&in_idx);
  analysis::DecorationManager::WhileEachDecoration((DecorationManager *)pDVar1,uVar3,0xb,&local_68);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_68);
  if (local_44 == 0x7fffffff) {
    var_type._4_4_ = opt::Instruction::opcode(var_local);
    this_00 = live_mgr;
    if ((var_type._4_4_ == OpAccessChain) || (var_type._4_4_ == OpInBoundsAccessChain)) {
      var_type._0_4_ = 1;
      uVar3 = opt::Instruction::type_id((Instruction *)deco_mgr);
      ptr_type = (Pointer *)analysis::TypeManager::GetType((TypeManager *)this_00,uVar3);
      iVar4 = (*(ptr_type->super_Type)._vptr_Type[0x21])();
      curr_type = (Type *)CONCAT44(extraout_var,iVar4);
      arr_type = (Array *)analysis::Pointer::pointee_type((Pointer *)curr_type);
      iVar4 = (*(arr_type->super_Type)._vptr_Type[0x18])();
      str_type = (Struct *)CONCAT44(extraout_var_00,iVar4);
      if (str_type != (Struct *)0x0) {
        arr_type = (Array *)analysis::Array::element_type((Array *)str_type);
        var_type._0_4_ = (uint32_t)var_type + 1;
      }
      iVar4 = (*(arr_type->super_Type)._vptr_Type[0x1e])();
      _member_idx_id = (Type *)CONCAT44(extraout_var_01,iVar4);
      member_idx_inst._4_4_ = analysis::TypeManager::GetId((TypeManager *)live_mgr,_member_idx_id);
      member_idx_inst._0_4_ = opt::Instruction::GetSingleWordInOperand(var_local,(uint32_t)var_type)
      ;
      pIStack_b0 = analysis::DefUseManager::GetDef
                             ((DefUseManager *)type_mgr,(uint32_t)member_idx_inst);
      OVar5 = opt::Instruction::opcode(pIStack_b0);
      if (OVar5 != OpConstant) {
        __assert_fail("member_idx_inst->opcode() == spv::Op::OpConstant && \"unexpected non-constant index\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                      ,0x9c,
                      "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                     );
      }
      local_e8.ac_idx = opt::Instruction::GetSingleWordInOperand(pIStack_b0,0);
      pDVar1 = def_use_mgr;
      uVar3 = member_idx_inst._4_4_;
      local_e8.builtin = &local_44;
      local_b4 = local_e8.ac_idx;
      std::function<bool(spvtools::opt::Instruction_const&)>::
      function<spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(spvtools::opt::Instruction*,spvtools::opt::Instruction*)::__1,void>
                ((function<bool(spvtools::opt::Instruction_const&)> *)&local_d8,&local_e8);
      analysis::DecorationManager::WhileEachDecoration
                ((DecorationManager *)pDVar1,uVar3,0xb,&local_d8);
      std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_d8);
      if (local_44 == 0x7fffffff) {
        __assert_fail("builtin != uint32_t(spv::BuiltIn::Max) && \"builtin not found\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                      ,0xac,
                      "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                     );
      }
      bVar2 = analysis::LivenessManager::IsAnalyzedBuiltin(_var_id,local_44);
      if ((bVar2) && (bVar2 = IsLiveBuiltin(this,local_44), !bVar2)) {
        KillAllStoresOfRef(this,var_local);
      }
    }
  }
  else {
    bVar2 = analysis::LivenessManager::IsAnalyzedBuiltin(_var_id,local_44);
    if ((bVar2) && (bVar2 = IsLiveBuiltin(this,local_44), !bVar2)) {
      KillAllStoresOfRef(this,var_local);
    }
  }
  return;
}

Assistant:

void EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(
    Instruction* ref, Instruction* var) {
  auto deco_mgr = context()->get_decoration_mgr();
  auto def_use_mgr = context()->get_def_use_mgr();
  auto type_mgr = context()->get_type_mgr();
  auto live_mgr = context()->get_liveness_mgr();
  // Search for builtin decoration of base variable
  uint32_t builtin = uint32_t(spv::BuiltIn::Max);
  auto var_id = var->result_id();
  (void)deco_mgr->WhileEachDecoration(
      var_id, uint32_t(spv::Decoration::BuiltIn),
      [&builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpDecorate && "unexpected decoration");
        builtin = deco.GetSingleWordInOperand(kOpDecorateBuiltInLiteralInIdx);
        return false;
      });
  // If analyzed builtin and not live, kill stores.
  if (builtin != uint32_t(spv::BuiltIn::Max)) {
    if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
      KillAllStoresOfRef(ref);
    return;
  }
  // Search for builtin decoration on indexed member
  auto ref_op = ref->opcode();
  if (ref_op != spv::Op::OpAccessChain &&
      ref_op != spv::Op::OpInBoundsAccessChain) {
    return;
  }
  uint32_t in_idx = kOpAccessChainIdx0InIdx;
  analysis::Type* var_type = type_mgr->GetType(var->type_id());
  analysis::Pointer* ptr_type = var_type->AsPointer();
  auto curr_type = ptr_type->pointee_type();
  auto arr_type = curr_type->AsArray();
  if (arr_type) {
    curr_type = arr_type->element_type();
    ++in_idx;
  }
  auto str_type = curr_type->AsStruct();
  auto str_type_id = type_mgr->GetId(str_type);
  auto member_idx_id = ref->GetSingleWordInOperand(in_idx);
  auto member_idx_inst = def_use_mgr->GetDef(member_idx_id);
  assert(member_idx_inst->opcode() == spv::Op::OpConstant &&
         "unexpected non-constant index");
  auto ac_idx = member_idx_inst->GetSingleWordInOperand(kOpConstantValueInIdx);
  (void)deco_mgr->WhileEachDecoration(
      str_type_id, uint32_t(spv::Decoration::BuiltIn),
      [ac_idx, &builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpMemberDecorate &&
               "unexpected decoration");
        auto deco_idx =
            deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx);
        if (deco_idx == ac_idx) {
          builtin =
              deco.GetSingleWordInOperand(kOpDecorateMemberBuiltInLiteralInIdx);
          return false;
        }
        return true;
      });
  assert(builtin != uint32_t(spv::BuiltIn::Max) && "builtin not found");
  // If analyzed builtin and not live, kill stores.
  if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
    KillAllStoresOfRef(ref);
}